

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,char *newFlags)

{
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *newFlags_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  if ((newFlags != (char *)0x0) && (*newFlags != '\0')) {
    local_20 = newFlags;
    newFlags_local = (char *)flags;
    flags_local = (string *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,newFlags,&local_41);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags, const char* newFlags)
{
  if (newFlags && *newFlags) {
    this->AppendFlags(flags, std::string(newFlags));
  }
}